

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleAverageVerifier::SampleAverageVerifier
          (SampleAverageVerifier *this,int _numSamples)

{
  float fVar1;
  float standardDeviation;
  float variance;
  int _numSamples_local;
  SampleAverageVerifier *this_local;
  
  Verifier::Verifier(&this->super_Verifier);
  (this->super_Verifier)._vptr_Verifier = (_func_int **)&PTR_verify_032bfe18;
  this->m_numSamples = _numSamples;
  this->m_isStatisticallySignificant = 3 < _numSamples;
  this->m_distanceThreshold = 0.0;
  fVar1 = ::deFloatSqrt(1.0 / ((float)this->m_numSamples * 12.0));
  this->m_distanceThreshold = fVar1 * 2.0;
  return;
}

Assistant:

SampleAverageVerifier::SampleAverageVerifier (int _numSamples)
	: m_numSamples					(_numSamples)
	, m_isStatisticallySignificant	(_numSamples >= 4)
	, m_distanceThreshold			(0.0f)
{
	// approximate Bates distribution as normal
	const float variance			= (1.0f / (12.0f * (float)m_numSamples));
	const float standardDeviation	= deFloatSqrt(variance);

	// 95% of means of sample positions are within 2 standard deviations if
	// they were randomly assigned. Sample patterns are expected to be more
	// uniform than a random pattern.
	m_distanceThreshold = 2 * standardDeviation;
}